

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::format_double_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,double value)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  char buf [64];
  char local_58 [64];
  
  pcVar2 = local_58;
  if (this->float_formatter == (FloatFormatter *)0x0) {
    cVar1 = this->current_locale_radix_character;
    sprintf(local_58,"%.32g");
    if (local_58[0] != '\0' && cVar1 != '.') {
      do {
        if (local_58[0] == cVar1) {
          *pcVar2 = '.';
        }
        local_58[0] = pcVar2[1];
        pcVar2 = pcVar2 + 1;
      } while (local_58[0] != '\0');
    }
    pcVar2 = strchr(local_58,0x2e);
    if ((pcVar2 == (char *)0x0) && (pcVar2 = strchr(local_58,0x65), pcVar2 == (char *)0x0)) {
      sVar3 = strlen(local_58);
      (local_58 + sVar3)[0] = '.';
      (local_58 + sVar3)[1] = '0';
      local_58[sVar3 + 2] = '\0';
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar3 = strlen(local_58);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_58,local_58 + sVar3);
  }
  else {
    (**(code **)(*(long *)this->float_formatter + 0x18))(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerGLSL::format_double(double value) const
{
	if (float_formatter)
		return float_formatter->format_double(value);

	// default behavior
	return convert_to_string(value, current_locale_radix_character);
}